

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall ktx::PrintDiff::endJsonSection(PrintDiff *this)

{
  bool bVar1;
  long in_RDI;
  char *nl;
  char (*in_stack_00000030) [3];
  undefined4 in_stack_00000038;
  int in_stack_0000003c;
  PrintIndent *in_stack_00000040;
  int in_stack_0000004c;
  PrintIndent *in_stack_00000050;
  
  bVar1 = std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x173bcb);
  if (bVar1) {
    if ((*(byte *)(in_RDI + 0x38) & 1) == 0) {
      PrintIndent::operator()
                (in_stack_00000050,in_stack_0000004c,(char (*) [3])in_stack_00000040,
                 (char **)CONCAT44(in_stack_0000003c,in_stack_00000038));
      PrintIndent::operator()(in_stack_00000040,in_stack_0000003c,in_stack_00000030);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::reset((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x173c37);
  }
  return;
}

Assistant:

void endJsonSection() {
        if (jsonSection.has_value()) {
            const auto nl = outputFormat != OutputFormat::json_mini ?  "\n" : "";
            if (!jsonSectionEmpty) {
                printIndent(0, "{}", nl);
                printIndent(1, "}}");
            }
            jsonSection.reset();
        }
    }